

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Node * __thiscall Parser::statement(Parser *this)

{
  bool bVar1;
  Node *pNVar2;
  
  bVar1 = tryEat(this,LBRACE);
  if (bVar1) {
    pNVar2 = compound_statement(this);
    return pNVar2;
  }
  bVar1 = tryEat(this,LET);
  if (bVar1) {
    pNVar2 = declaration(this);
    return pNVar2;
  }
  bVar1 = tryEat(this,IDENTIFIER);
  if (bVar1) {
    pNVar2 = set(this);
    return pNVar2;
  }
  bVar1 = tryEat(this,IF);
  if (bVar1) {
    pNVar2 = selection_statement(this);
    return pNVar2;
  }
  bVar1 = tryEat(this,FOR);
  if (bVar1) {
    pNVar2 = cycle_for(this);
    return pNVar2;
  }
  tryEat(this,PRINTLN);
  pNVar2 = println(this);
  return pNVar2;
}

Assistant:

Node* Parser::statement()
{
	if (tryEat(token_type::LBRACE)) {
		Node* compound_node = compound_statement();
		return compound_node;
	}
	else if (tryEat(token_type::LET)) {
		Node* declaration_node = declaration();
		return declaration_node;
	}
	else if (tryEat(token_type::IDENTIFIER)) {
		Node* assign_node = set();
		return assign_node;
	}
	else if (tryEat(token_type::IF)) {
		Node* selection_node = selection_statement();
		return selection_node;
	}
	else if (tryEat(token_type::FOR)) {
		Node* cycle_for_node = cycle_for();
		return cycle_for_node;
	}
	else if (tryEat(token_type::PRINTLN)) {
		Node* println_node = println();
		return println_node;
	}
}